

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeSymbolMap(WasmBinaryWriter *this)

{
  pointer puVar1;
  Function *pFVar2;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import_1;
  pointer puVar3;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  ofstream local_240 [8];
  ofstream file;
  anon_class_16_2_3f216d3b local_40;
  
  std::ofstream::ofstream(local_240,(string *)&this->symbolMap,_S_out);
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40.file = local_240;
  local_40.this = this;
  for (puVar3 = (this->wasm->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pFVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(pFVar2->super_Importable).module + 8) != (char *)0x0) {
      writeSymbolMap::anon_class_16_2_3f216d3b::operator()(&local_40,pFVar2);
    }
  }
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40.file = local_240;
  local_40.this = this;
  for (puVar3 = (this->wasm->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pFVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(pFVar2->super_Importable).module + 8) == (char *)0x0) {
      writeSymbolMap::anon_class_16_2_3f216d3b::operator()(&local_40,pFVar2);
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_240);
  return;
}

Assistant:

void WasmBinaryWriter::writeSymbolMap() {
  std::ofstream file(symbolMap);
  auto write = [&](Function* func) {
    file << getFunctionIndex(func->name) << ":" << func->name.str << std::endl;
  };
  ModuleUtils::iterImportedFunctions(*wasm, write);
  ModuleUtils::iterDefinedFunctions(*wasm, write);
  file.close();
}